

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::ParameterSetupErrorsTest::Testfv
          (ParameterSetupErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  undefined4 extraout_var;
  ErrorsUtilities *pEVar13;
  GLfloat min_filter_invalid;
  GLfloat wrap_invalid;
  GLfloat minus_one;
  GLfloat one;
  GLfloat depth_stencil_mode_invalid;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  float local_34;
  long lVar12;
  
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar11);
  local_38 = 0x3f800000;
  local_3c = 0xbf800000;
  local_34 = (float)this->m_depth_stencil_mode_invalid;
  local_40 = 0x47074300;
  local_44 = 0x461c0000;
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar12 + 0x1420))(pEVar13,this->m_pname_invalid,&local_38);
  bVar1 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x500,"glTextureParameterfv",
                     "pname is not one of the accepted defined values.");
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar12 + 0x1420))(pEVar13,0x90ea,&local_34);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x500,"glTextureParameterfv",
                     "params should have a defined constant value (based on the value of pname) and does not."
                    );
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar12 + 0x1420))(pEVar13,0x8501,&local_38);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x500,"glTextureParameterfv",
                     "the  effective target is either TEXTURE_2D_MULTISAMPLE or  TEXTURE_2D_MULTISAMPLE_ARRAY, and pname is any of the sampler states."
                    );
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_rectangle;
  (**(code **)(lVar12 + 0x1420))(pEVar13,0x2802,&local_40);
  bVar4 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x500,"glTextureParameterfv",
                     "the effective target is TEXTURE_RECTANGLE and either of pnames TEXTURE_WRAP_S or TEXTURE_WRAP_T is set to either MIRROR_CLAMP_TO_EDGE, MIRRORED_REPEAT or REPEAT."
                    );
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_rectangle;
  (**(code **)(lVar12 + 0x1420))(pEVar13,0x2801,&local_44);
  bVar5 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x500,"glTextureParameterfv",
                     "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_MIN_FILTER is set to a value other than NEAREST or LINEAR (no mipmap filtering is permitted)."
                    );
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar12 + 0x1420))(pEVar13,0x813c,&local_38);
  bVar6 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x502,"glTextureParameterfv",
                     "the effective target is either TEXTURE_2D_MULTISAMPLE or TEXTURE_2D_MULTISAMPLE_ARRAY, and pname TEXTURE_BASE_LEVEL is set to a value other than zero."
                    );
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_invalid;
  (**(code **)(lVar12 + 0x1420))(pEVar13,0x8501,&local_38);
  bVar7 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x502,"glTextureParameterfv",
                     "texture is not the name of an existing texture object.");
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_rectangle;
  (**(code **)(lVar12 + 0x1420))(pEVar13,0x813c,&local_38);
  bVar8 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x502,"glTextureParameterfv",
                     "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_BASE_LEVEL is set to any value other than zero. "
                    );
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar12 + 0x1420))(pEVar13,0x813c,&local_3c);
  bVar9 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x501,"glTextureParameterfv",
                     "pname is TEXTURE_BASE_LEVEL and param is negative.");
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar12 + 0x1420))(pEVar13,0x813d,&local_3c);
  bVar10 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar13,(this->super_TestCase).m_context,0x501,"glTextureParameterfv",
                      "pname is TEXTURE_MAX_LEVEL and param is negative.");
  return (bVar10 && (bVar9 && bVar8)) &&
         ((bVar7 && (bVar6 && bVar5)) && ((bVar4 && bVar3) && (bVar2 && bVar1)));
}

Assistant:

bool ParameterSetupErrorsTest::Testfv()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	glw::GLfloat one						= 1.f;
	glw::GLfloat minus_one					= -1.f;
	glw::GLfloat depth_stencil_mode_invalid = (glw::GLfloat)m_depth_stencil_mode_invalid;
	glw::GLfloat wrap_invalid				= (glw::GLfloat)GL_MIRROR_CLAMP_TO_EDGE;
	glw::GLfloat min_filter_invalid			= (glw::GLfloat)GL_NEAREST_MIPMAP_NEAREST;

	/* Check that INVALID_ENUM is generated by TextureParameter* if pname is
	 not one of the accepted defined values. */
	{
		gl.textureParameterfv(m_to_2D, m_pname_invalid, &one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterfv",
								  "pname is not one of the accepted defined values.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if params
	 should have a defined constant value (based on the value of pname) and
	 does not. */
	{
		gl.textureParameterfv(m_to_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, &depth_stencil_mode_invalid);

		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterfv",
							 "params should have a defined constant value (based on the value of pname) and does not.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if the
	 effective target is either TEXTURE_2D_MULTISAMPLE or
	 TEXTURE_2D_MULTISAMPLE_ARRAY, and pname is any of the sampler states. */
	{
		gl.textureParameterfv(m_to_2D_ms, GL_TEXTURE_LOD_BIAS, &one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterfv",
								  "the  effective target is either TEXTURE_2D_MULTISAMPLE or  "
								  "TEXTURE_2D_MULTISAMPLE_ARRAY, and pname is any of the sampler states.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if the
	 effective target is TEXTURE_RECTANGLE and either of pnames
	 TEXTURE_WRAP_S or TEXTURE_WRAP_T is set to either MIRROR_CLAMP_TO_EDGE,
	 MIRRORED_REPEAT or REPEAT. */
	{
		gl.textureParameterfv(m_to_rectangle, GL_TEXTURE_WRAP_S, &wrap_invalid);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterfv",
								  "the effective target is TEXTURE_RECTANGLE and either of pnames TEXTURE_WRAP_S or "
								  "TEXTURE_WRAP_T is set to either MIRROR_CLAMP_TO_EDGE, MIRRORED_REPEAT or REPEAT.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if the
	 effective target is TEXTURE_RECTANGLE and pname TEXTURE_MIN_FILTER is
	 set to a value other than NEAREST or LINEAR (no mipmap filtering is
	 permitted). */
	{
		gl.textureParameterfv(m_to_rectangle, GL_TEXTURE_MIN_FILTER, &min_filter_invalid);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterfv",
								  "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_MIN_FILTER is set to a "
								  "value other than NEAREST or LINEAR (no mipmap filtering is permitted).");
	}

	/* Check that INVALID_OPERATION is generated by TextureParameter* if the
	 effective target is either TEXTURE_2D_MULTISAMPLE or
	 TEXTURE_2D_MULTISAMPLE_ARRAY, and pname TEXTURE_BASE_LEVEL is set to a
	 value other than zero. */
	{
		gl.textureParameterfv(m_to_2D_ms, GL_TEXTURE_BASE_LEVEL, &one);

		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureParameterfv",
							 "the effective target is either TEXTURE_2D_MULTISAMPLE or TEXTURE_2D_MULTISAMPLE_ARRAY, "
							 "and pname TEXTURE_BASE_LEVEL is set to a value other than zero.");
	}

	/* Check that INVALID_OPERATION is generated by TextureParameter* if
	 texture is not the name of an existing texture object. */
	{
		gl.textureParameterfv(m_to_invalid, GL_TEXTURE_LOD_BIAS, &one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureParameterfv",
								  "texture is not the name of an existing texture object.");
	}

	/* Check that INVALID_OPERATION is generated by TextureParameter* if the
	 effective target is TEXTURE_RECTANGLE and pname TEXTURE_BASE_LEVEL is
	 set to any value other than zero. */
	{
		gl.textureParameterfv(m_to_rectangle, GL_TEXTURE_BASE_LEVEL, &one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureParameterfv",
								  "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_BASE_LEVEL is set to "
								  "any value other than zero. ");
	}

	/* Check that INVALID_VALUE is generated by TextureParameter* if pname is
	 TEXTURE_BASE_LEVEL or TEXTURE_MAX_LEVEL, and param or params is
	 negative. */
	{
		gl.textureParameterfv(m_to_2D, GL_TEXTURE_BASE_LEVEL, &minus_one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureParameterfv",
								  "pname is TEXTURE_BASE_LEVEL and param is negative.");

		gl.textureParameterfv(m_to_2D, GL_TEXTURE_MAX_LEVEL, &minus_one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureParameterfv",
								  "pname is TEXTURE_MAX_LEVEL and param is negative.");
	}

	return is_ok;
}